

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::~SAT(SAT *this)

{
  double *pdVar1;
  bool *pbVar2;
  int *piVar3;
  IntVar **__ptr;
  Lit *pLVar4;
  char *pcVar5;
  LitFlags *__ptr_00;
  Reason *__ptr_01;
  ChannelInfo *__ptr_02;
  Clause **ppCVar6;
  ulong uVar7;
  
  (this->super_Branching)._vptr_Branching = (_func_int **)&PTR_finished_0020f848;
  if ((this->clauses).sz != 0) {
    uVar7 = 0;
    do {
      free((this->clauses).data[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->clauses).sz);
  }
  if ((this->learnts).sz != 0) {
    uVar7 = 0;
    do {
      free((this->learnts).data[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->learnts).sz);
  }
  pdVar1 = (this->learnt_len_occ).data;
  if (pdVar1 != (double *)0x0) {
    free(pdVar1);
  }
  (this->learnt_len_occ).data = (double *)0x0;
  pbVar2 = (this->polarity).data;
  if (pbVar2 != (bool *)0x0) {
    free(pbVar2);
  }
  (this->polarity).data = (bool *)0x0;
  piVar3 = (this->order_heap).indices.data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->order_heap).indices.data = (int *)0x0;
  piVar3 = (this->order_heap).heap.data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->order_heap).heap.data = (int *)0x0;
  pdVar1 = (this->activity).data;
  if (pdVar1 != (double *)0x0) {
    free(pdVar1);
  }
  (this->activity).data = (double *)0x0;
  __ptr = (this->min_vars).data;
  if (__ptr != (IntVar **)0x0) {
    free(__ptr);
  }
  (this->min_vars).data = (IntVar **)0x0;
  pLVar4 = (this->analyze_toclear).data;
  if (pLVar4 != (Lit *)0x0) {
    free(pLVar4);
  }
  (this->analyze_toclear).data = (Lit *)0x0;
  pLVar4 = (this->analyze_stack).data;
  if (pLVar4 != (Lit *)0x0) {
    free(pLVar4);
  }
  (this->analyze_stack).data = (Lit *)0x0;
  piVar3 = (this->ivseen_toclear).data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->ivseen_toclear).data = (int *)0x0;
  pbVar2 = (this->ivseen).data;
  if (pbVar2 != (bool *)0x0) {
    free(pbVar2);
  }
  (this->ivseen).data = (bool *)0x0;
  pcVar5 = (this->seen).data;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  (this->seen).data = (char *)0x0;
  piVar3 = (this->out_learnt_level).data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->out_learnt_level).data = (int *)0x0;
  pLVar4 = (this->out_learnt).data;
  if (pLVar4 != (Lit *)0x0) {
    free(pLVar4);
  }
  (this->out_learnt).data = (Lit *)0x0;
  vec<vec<Clause_*>_>::~vec(&this->rtrail);
  piVar3 = (this->qhead).data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->qhead).data = (int *)0x0;
  vec<vec<Lit>_>::~vec(&this->trail);
  piVar3 = (this->num_used).data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->num_used).data = (int *)0x0;
  piVar3 = (this->var_free_list).data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->var_free_list).data = (int *)0x0;
  __ptr_00 = (this->flags).data;
  if (__ptr_00 != (LitFlags *)0x0) {
    free(__ptr_00);
  }
  (this->flags).data = (LitFlags *)0x0;
  piVar3 = (this->trailpos).data;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  (this->trailpos).data = (int *)0x0;
  __ptr_01 = (this->reason).data;
  if (__ptr_01 != (Reason *)0x0) {
    free(__ptr_01);
  }
  (this->reason).data = (Reason *)0x0;
  pcVar5 = (this->assigns).data;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  (this->assigns).data = (char *)0x0;
  vec<vec<WatchElem>_>::~vec(&this->watches);
  __ptr_02 = (this->c_info).data;
  if (__ptr_02 != (ChannelInfo *)0x0) {
    free(__ptr_02);
  }
  (this->c_info).data = (ChannelInfo *)0x0;
  ppCVar6 = (this->learnts).data;
  if (ppCVar6 != (Clause **)0x0) {
    free(ppCVar6);
  }
  (this->learnts).data = (Clause **)0x0;
  ppCVar6 = (this->clauses).data;
  if (ppCVar6 != (Clause **)0x0) {
    free(ppCVar6);
  }
  (this->clauses).data = (Clause **)0x0;
  return;
}

Assistant:

SAT::~SAT() {
	for (unsigned int i = 0; i < clauses.size(); i++) {
		free(clauses[i]);
	}
	for (unsigned int i = 0; i < learnts.size(); i++) {
		free(learnts[i]);
	}
}